

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GenericData.hpp
# Opt level: O0

void __thiscall
OpenMD::SimpleTypeData<OpenMD::EAMParameters>::~SimpleTypeData
          (SimpleTypeData<OpenMD::EAMParameters> *this)

{
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__SimpleTypeData_005251b0;
  EAMParameters::~EAMParameters((EAMParameters *)0x35d3ba);
  GenericData::~GenericData((GenericData *)0x35d3c4);
  return;
}

Assistant:

SimpleTypeData() : GenericData(), data_(ElemDataType()) {}